

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

vector<Tetris,_std::allocator<Tetris>_> * __thiscall
GameBoard::getPlaces
          (GameBoard *this,int id,int blockType,vector<Tetris,_std::allocator<Tetris>_> *ans,
          bool unique)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int o;
  ulong uVar12;
  int y;
  long lVar13;
  bool bVar14;
  Tetris local_d0;
  int local_a4;
  vector<Tetris,_std::allocator<Tetris>_> *local_a0;
  ulong local_98;
  int (*local_90) [4];
  int (*local_88) [4];
  queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> q;
  
  uVar7 = (ulong)(uint)blockType;
  uVar6 = (ulong)(uint)id;
  local_a0 = ans;
  std::queue<Tetris,std::deque<Tetris,std::allocator<Tetris>>>::
  queue<std::deque<Tetris,std::allocator<Tetris>>,void>(&q);
  memset(getPlaces::vis,0,0x420);
  local_d0.shape = blockShape[blockType];
  piVar3 = this->gridInfo[(long)id + -1][0x15] + 7;
  iVar4 = 0x14;
  do {
    iVar10 = iVar4;
    lVar8 = 0xf6;
    bVar14 = false;
    while ((uVar9 = lVar8 - 0xf5, uVar9 < 0xb && (!bVar14))) {
      piVar1 = piVar3 + lVar8;
      lVar8 = lVar8 + 1;
      bVar14 = *piVar1 != 0;
    }
    piVar3 = piVar3 + -0xc;
    iVar4 = iVar10 + -1;
  } while (!bVar14);
  local_98 = (ulong)(iVar10 + 1);
  local_88 = blockHalfHeight + blockType;
  local_90 = blockHeight + blockType;
  local_d0.gameBoard = this;
  local_d0.blockType = blockType;
  local_d0.color = id;
  local_a4 = blockType;
  for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
    uVar2 = ((*local_88)[uVar12] - (*local_90)[uVar12]) + 0x15;
    uVar11 = (*local_90)[uVar12] + (int)local_98;
    if ((int)uVar2 <= (int)uVar11) {
      uVar11 = uVar2;
    }
    uVar5 = 1;
    while (iVar4 = (int)uVar5, iVar4 != 0xb) {
      uVar7 = uVar7 & 0xffffffff;
      if (uVar11 != 0xffffffff) {
        uVar7 = (ulong)uVar11;
      }
      local_d0.blockX = (int)uVar7;
      local_d0.orientation = (int)uVar12;
      local_d0.blockY = iVar4;
      bVar14 = Tetris::isValid(&local_d0,-1,-1,-1);
      uVar9 = uVar12 & 0xffffffff;
      if (bVar14) {
        std::deque<Tetris,_std::allocator<Tetris>_>::push_back(&q.c,&local_d0);
        uVar7 = (ulong)local_d0.blockX;
        uVar5 = (ulong)local_d0.blockY;
        uVar9 = (ulong)local_d0.orientation;
        getPlaces::vis[uVar7][uVar5][uVar9] = true;
      }
      uVar6 = uVar5;
      uVar5 = (ulong)(iVar4 + 1);
    }
  }
  do {
    local_d0.blockX = (uint)uVar7;
    if ((q.c.super__Deque_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Deque_impl_data.
         _M_start._M_cur)->blockX != 0xffffffff) {
      local_d0.blockX =
           (q.c.super__Deque_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Deque_impl_data.
            _M_start._M_cur)->blockX;
    }
    local_d0.blockY = (int)uVar6;
    if ((q.c.super__Deque_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Deque_impl_data.
         _M_start._M_cur)->blockY != -1) {
      local_d0.blockY =
           (q.c.super__Deque_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Deque_impl_data.
            _M_start._M_cur)->blockY;
    }
    local_d0.orientation = (uint)uVar9;
    if ((q.c.super__Deque_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Deque_impl_data.
         _M_start._M_cur)->orientation != 0xffffffff) {
      local_d0.orientation =
           (q.c.super__Deque_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Deque_impl_data.
            _M_start._M_cur)->orientation;
    }
    std::deque<Tetris,_std::allocator<Tetris>_>::pop_front(&q.c);
    bVar14 = Tetris::onGround(&local_d0);
    if (bVar14) {
      std::vector<Tetris,_std::allocator<Tetris>_>::push_back(local_a0,&local_d0);
    }
    iVar4 = local_d0.blockY + 1;
    uVar7 = (ulong)(uint)local_d0.blockX;
    uVar9 = (ulong)(uint)local_d0.orientation;
    lVar13 = (long)local_d0.blockX;
    lVar8 = (long)local_d0.orientation;
    if ((*(char *)(lVar8 + lVar13 * 0x30 + (long)local_d0.blockY * 4 + 0x121f04) == '\0') &&
       (local_d0.blockY = iVar4, bVar14 = Tetris::isValid(&local_d0,-1,-1,-1), bVar14)) {
      std::deque<Tetris,_std::allocator<Tetris>_>::push_back(&q.c,&local_d0);
      uVar7 = (ulong)(uint)local_d0.blockX;
      uVar9 = (ulong)(uint)local_d0.orientation;
      lVar13 = (long)local_d0.blockX;
      lVar8 = (long)local_d0.orientation;
      getPlaces::vis[lVar13][local_d0.blockY][lVar8] = true;
      iVar4 = local_d0.blockY;
    }
    iVar10 = iVar4 + -2;
    if ((*(char *)(lVar8 + lVar13 * 0x30 + 0x121ef8 + (long)iVar4 * 4) == '\0') &&
       (local_d0.blockY = iVar10, bVar14 = Tetris::isValid(&local_d0,-1,-1,-1), bVar14)) {
      std::deque<Tetris,_std::allocator<Tetris>_>::push_back(&q.c,&local_d0);
      uVar7 = (ulong)local_d0.blockX;
      uVar9 = (ulong)(uint)local_d0.orientation;
      lVar8 = (long)local_d0.orientation;
      getPlaces::vis[uVar7][local_d0.blockY][lVar8] = true;
      iVar10 = local_d0.blockY;
    }
    local_d0.blockY = iVar10 + 1;
    uVar6 = (ulong)(uint)local_d0.blockY;
    local_d0.blockX = (int)uVar7 + -1;
    if ((*(char *)(lVar8 + (long)local_d0.blockX * 0x30 + 0x121f04 + (long)iVar10 * 4) == '\0') &&
       (bVar14 = Tetris::isValid(&local_d0,-1,-1,-1), bVar14)) {
      std::deque<Tetris,_std::allocator<Tetris>_>::push_back(&q.c,&local_d0);
      uVar6 = (ulong)local_d0.blockY;
      uVar9 = (ulong)local_d0.orientation;
      getPlaces::vis[local_d0.blockX][uVar6][uVar9] = true;
      uVar7 = (ulong)(local_d0.blockX + 1);
    }
    if (local_a4 != 6) {
      iVar4 = ((int)uVar9 + 1) % 4;
      local_d0.blockX = (int)uVar7;
      bVar14 = Tetris::rotation(&local_d0,iVar4);
      if ((bVar14) && (getPlaces::vis[(int)uVar7][(int)uVar6][iVar4] == false)) {
        local_d0.orientation = iVar4;
        std::deque<Tetris,_std::allocator<Tetris>_>::push_back(&q.c,&local_d0);
        uVar7 = (ulong)local_d0.blockX;
        uVar6 = (ulong)local_d0.blockY;
        uVar9 = (ulong)local_d0.orientation;
        getPlaces::vis[uVar7][uVar6][uVar9] = true;
      }
    }
  } while( true );
}

Assistant:

vector<Tetris> &GameBoard::getPlaces(int id, int blockType, vector<Tetris> &ans, bool unique)
{
    queue<Tetris> q;
    static bool vis[MAPHEIGHT + 2][MAPWIDTH + 2][4];
    memset(vis, 0, sizeof(vis));
    Tetris tmp(this, blockType, id);
    int mh = MAPHEIGHT;
    while (1) {
        bool hv = false;
        for (int i = 1; i <= MAPWIDTH && !hv; ++i)
            if (gridInfo[id][mh][i] != 0)
                hv = true;
        if (hv)
            break;
        --mh;
    }
    for (int o = 0; o < 4; ++o) {
        int xo = MAPHEIGHT + blockHalfHeight[blockType][o] - blockHeight[blockType][o] + 1;
        xo = min(xo, mh + blockHeight[blockType][o] + 1);
        for (int y = 1; y <= MAPWIDTH; ++y)
            if (tmp.set(xo, y, o).isValid()) {
                q.push(tmp);
                vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
            }
    }
    //vector<Tetris> ans;
    while (!q.empty()) {
        auto &fr = q.front();
        tmp.set(fr.blockX, fr.blockY, fr.orientation);
        q.pop();
        if (tmp.onGround())
            ans.push_back(tmp);
        ++tmp.blockY;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        --tmp.blockY, --tmp.blockY;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        ++tmp.blockY, --tmp.blockX;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        ++tmp.blockX;
        if (blockType != 6) {
            int o2 = (tmp.orientation + 1) % 4;
            if (tmp.rotation(o2) && !vis[tmp.blockX][tmp.blockY][o2]) {
                tmp.orientation = o2;
                q.push(tmp);
                vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
            }
        }
    }
    /*if (!unique)
        return _ans = ans;
    _ans.clear();
    for (auto &i : ans) {
        bool hit = false;
        for (auto &t : _ans)
            if (i.same(t)) {
                hit = true;
                break;
            }
        if (!hit)
            _ans.push_back(i);
    }
    return _ans;*/
}